

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_lib.hpp
# Opt level: O3

void __thiscall
deci::binop_t<deci::eq_xclass_t>::Evaluate
          (binop_t<deci::eq_xclass_t> *this,vm_t *param_1,stack_t *stack,stack_t *local)

{
  value_t *pvVar1;
  long lVar2;
  long lVar3;
  number_t local_30;
  
  pvVar1 = stack_t::Top(stack,1);
  lVar2 = __dynamic_cast(pvVar1,&value_t::typeinfo,&number_t::typeinfo,0);
  if (lVar2 != 0) {
    pvVar1 = stack_t::Top(stack,0);
    lVar3 = __dynamic_cast(pvVar1,&value_t::typeinfo,&number_t::typeinfo,0);
    if (lVar3 != 0) {
      number_t::number_t(&local_30,
                         (double)(-(ulong)(*(double *)(lVar3 + 0x10) == *(double *)(lVar2 + 0x10)) &
                                 0x3ff0000000000000));
      stack_t::Result(local,&local_30.super_value_t);
      number_t::~number_t(&local_30);
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void Evaluate(vm_t&, const stack_t& stack, stack_t& local) override {
      number_t& a = dynamic_cast<number_t&>(stack.Top(1));
      number_t& b = dynamic_cast<number_t&>(stack.Top(0));
      local.Result(number_t(xclass::Execute(a.Value(), b.Value())));
    }